

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES>::
prepare_compute_shader
          (string *__return_storage_ptr__,
          InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type,string *function_definition,string *function_use,
          string *verification)

{
  string *verification_local;
  string *function_use_local;
  string *function_definition_local;
  TestShaderType tested_shader_type_local;
  InteractionFunctionCalls1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  string *compute_shader_source;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (tested_shader_type == COMPUTE_SHADER_TYPE) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"writeonly uniform image2D uni_image;\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)function_definition)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)shader_start_abi_cxx11_);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)function_use);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)verification);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "\n    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n}\n\n"
              );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InteractionFunctionCalls1<API>::prepare_compute_shader(
	typename TestCaseBase<API>::TestShaderType tested_shader_type, const std::string& function_definition,
	const std::string& function_use, const std::string& verification)
{
	std::string compute_shader_source;

	if (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type)
	{
		compute_shader_source = "writeonly uniform image2D uni_image;\n"
								"\n";

		/* User-defined function definition. */
		compute_shader_source += function_definition;
		compute_shader_source += "\n\n";

		/* Main function definition. */
		compute_shader_source += shader_start;
		compute_shader_source += function_use;
		compute_shader_source += "\n\n";
		compute_shader_source += verification;
		compute_shader_source += "\n\n";
		compute_shader_source += "\n"
								 "    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), vec4(result, 0, 0, 0));\n"
								 "}\n"
								 "\n";
	}

	return compute_shader_source;
}